

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.hpp
# Opt level: O2

int64_t duckdb_jaro_winkler::common::remove_common_prefix<char_const*,char_const*>
                  (char **first1,char *last1,char **first2,char *last2)

{
  char *pcVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  
  pcVar1 = *first1;
  lVar2 = (long)last2 - (long)*first2;
  if ((long)last1 - (long)pcVar1 <= lVar2) {
    lVar2 = (long)last1 - (long)pcVar1;
  }
  lVar4 = 0;
  if (lVar2 < 1) {
    lVar2 = lVar4;
  }
  for (; (lVar3 = lVar2, lVar2 != lVar4 && (lVar3 = lVar4, pcVar1[lVar4] == (*first2)[lVar4]));
      lVar4 = lVar4 + 1) {
  }
  *first1 = pcVar1 + lVar3;
  *first2 = *first2 + lVar3;
  return lVar3;
}

Assistant:

int64_t remove_common_prefix(InputIt1& first1, InputIt1 last1, InputIt2& first2, InputIt2 last2)
{
	// DuckDB passes a raw pointer, but this gives compile errors for std::
	int64_t len1 = std::distance(first1, last1);
	int64_t len2 = std::distance(first2, last2);
	const int64_t max_comparisons = std::min<int64_t>(len1, len2);
	int64_t prefix;
	for (prefix = 0; prefix < max_comparisons; prefix++) {
		if (first1[prefix] != first2[prefix]) {
			break;
		}
	}

//    int64_t prefix = static_cast<int64_t>(
//        std::distance(first1, std::mismatch(first1, last1, first2, last2).first));
    first1 += prefix;
    first2 += prefix;
    return prefix;
}